

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_decode(uchar **out,uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  byte *data;
  LodePNGColorMode *info;
  LodePNGColorMode *info_00;
  LodePNGInfo *info_01;
  uint uVar1;
  uint uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte bVar6;
  bool bVar7;
  uchar **ppuVar8;
  uchar uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  size_t i;
  uchar *puVar16;
  uchar *puVar17;
  size_t sVar18;
  ulong uVar19;
  size_t sVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  size_t bytewidth;
  bool bVar27;
  ulong local_2b0;
  uchar *scanlines;
  uchar **local_260;
  size_t *local_258;
  uchar **local_250;
  size_t scanlines_size;
  size_t local_240;
  uint passh_1 [7];
  uint passw_1 [7];
  uint passh [7];
  uint passw [7];
  size_t passstart [8];
  size_t local_178 [8];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  
  scanlines = (uchar *)0x0;
  scanlines_size = 0;
  *out = (uchar *)0x0;
  *h = 0;
  *w = 0;
  uVar10 = lodepng_inspect(w,h,state,in,insize);
  state->error = uVar10;
  if (uVar10 == 0) {
    uVar14 = *w;
    uVar13 = *h;
    uVar10 = 0x5c;
    if (CONCAT44(0,uVar13) * (ulong)uVar14 >> 0x3d == 0) {
      info = &(state->info_png).color;
      info_00 = &state->info_raw;
      local_260 = out;
      uVar11 = lodepng_get_bpp(info);
      uVar12 = lodepng_get_bpp(info_00);
      if (uVar12 < uVar11) {
        uVar12 = uVar11;
      }
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (ulong)(uVar14 >> 3) * (ulong)uVar12 +
                     ((ulong)(uVar14 & 7) * (ulong)uVar12 + 7 >> 3) + 5;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = CONCAT44(0,uVar13);
      if (SUB168(auVar4 * auVar5,8) == 0) {
        puVar16 = (uchar *)malloc(insize);
        if (puVar16 != (uchar *)0x0) {
          info_01 = &state->info_png;
          puVar17 = in + 0x21;
          local_250 = (state->info_png).unknown_chunks_data;
          local_258 = (state->info_png).unknown_chunks_size;
          iVar15 = 1;
          local_2b0 = 0;
          bVar27 = false;
LAB_0011bf81:
          data = puVar17 + 8;
LAB_0011bfa4:
          if (!bVar27) {
            if (insize < puVar17 + (0xc - (long)in) || puVar17 < in) {
              bVar27 = true;
              if ((state->decoder).ignore_end == 0) {
                uVar10 = 0x1e;
                goto LAB_0011c404;
              }
              goto LAB_0011c40f;
            }
            uVar10 = lodepng_read32bitInt(puVar17);
            if ((int)uVar10 < 0) {
              bVar27 = true;
              if ((state->decoder).ignore_end != 0) goto LAB_0011c40f;
              uVar10 = 0x3f;
LAB_0011c404:
              state->error = uVar10;
              bVar27 = false;
              goto LAB_0011c40f;
            }
            uVar22 = (ulong)uVar10;
            if (insize < puVar17 + (0xc - (long)in) + uVar22) {
              uVar10 = 0x40;
              goto LAB_0011c404;
            }
            uVar9 = lodepng_chunk_type_equals(puVar17,"IDAT");
            if (uVar9 != '\0') {
              if ((!CARRY8(local_2b0,uVar22)) && (local_2b0 + uVar22 <= insize)) {
                lodepng_memcpy(puVar16 + local_2b0,data,uVar22);
                bVar7 = true;
                bVar27 = false;
                iVar15 = 3;
                local_2b0 = local_2b0 + uVar22;
                goto LAB_0011c109;
              }
              uVar10 = 0x5f;
              goto LAB_0011c404;
            }
            uVar9 = lodepng_chunk_type_equals(puVar17,"IEND");
            if (uVar9 != '\0') {
              bVar27 = true;
              bVar7 = false;
              goto LAB_0011c109;
            }
            uVar9 = lodepng_chunk_type_equals(puVar17,"PLTE");
            if (uVar9 != '\0') {
              uVar10 = readChunk_PLTE(info,data,uVar22);
              state->error = uVar10;
              if (uVar10 != 0) goto LAB_0011c40f;
              bVar7 = true;
              bVar27 = false;
              iVar15 = 2;
              goto LAB_0011c109;
            }
            uVar9 = lodepng_chunk_type_equals(puVar17,"tRNS");
            if (uVar9 == '\0') {
              uVar9 = lodepng_chunk_type_equals(puVar17,"bKGD");
              if (uVar9 != '\0') {
                uVar10 = readChunk_bKGD(info_01,data,uVar22);
                goto LAB_0011c0f1;
              }
              uVar9 = lodepng_chunk_type_equals(puVar17,"tEXt");
              if (uVar9 != '\0') {
                if ((state->decoder).read_text_chunks == 0) goto LAB_0011c106;
                uVar10 = readChunk_tEXt(info_01,data,uVar22);
LAB_0011c1de:
                state->error = uVar10;
                goto joined_r0x0011c1e6;
              }
              uVar9 = lodepng_chunk_type_equals(puVar17,"zTXt");
              if (uVar9 == '\0') {
                uVar9 = lodepng_chunk_type_equals(puVar17,"iTXt");
                if (uVar9 == '\0') {
                  uVar9 = lodepng_chunk_type_equals(puVar17,"tIME");
                  if (uVar9 == '\0') {
                    uVar9 = lodepng_chunk_type_equals(puVar17,"pHYs");
                    if (uVar9 == '\0') {
                      uVar9 = lodepng_chunk_type_equals(puVar17,"gAMA");
                      if (uVar9 != '\0') {
                        uVar10 = readChunk_gAMA(info_01,data,uVar22);
                        goto LAB_0011c0f1;
                      }
                      uVar9 = lodepng_chunk_type_equals(puVar17,"cHRM");
                      if (uVar9 == '\0') {
                        uVar9 = lodepng_chunk_type_equals(puVar17,"sRGB");
                        if (uVar9 != '\0') {
                          if (uVar10 == 1) {
                            (state->info_png).srgb_defined = 1;
                            (state->info_png).srgb_intent = (uint)*data;
                            state->error = 0;
                            goto LAB_0011c106;
                          }
                          uVar10 = 0x62;
                          goto LAB_0011c404;
                        }
                        uVar9 = lodepng_chunk_type_equals(puVar17,"iCCP");
                        if (uVar9 != '\0') {
                          uVar10 = readChunk_iCCP(info_01,(LodePNGDecompressSettings *)state,data,
                                                  uVar22);
                          state->error = uVar10;
                          goto joined_r0x0011c1e6;
                        }
                        if (((state->decoder).ignore_critical != 0) || ((puVar17[4] & 0x20) != 0)) {
                          if ((state->decoder).remember_unknown_chunks != 0) {
                            uVar10 = lodepng_chunk_append
                                               (local_250 + (iVar15 - 1U),local_258 + (iVar15 - 1U),
                                                puVar17);
                            state->error = uVar10;
                            if (uVar10 != 0) goto LAB_0011c40f;
                          }
                          bVar27 = false;
                          goto LAB_0011c370;
                        }
                        uVar10 = 0x45;
                        goto LAB_0011c404;
                      }
                      uVar10 = readChunk_cHRM(info_01,data,uVar22);
                    }
                    else {
                      uVar10 = readChunk_pHYs(info_01,data,uVar22);
                    }
                  }
                  else {
                    uVar10 = readChunk_tIME(info_01,data,uVar22);
                  }
                  goto LAB_0011c0f1;
                }
                if ((state->decoder).read_text_chunks != 0) {
                  uVar10 = readChunk_iTXt(info_01,(LodePNGDecompressSettings *)state,data,uVar22);
                  goto LAB_0011c1de;
                }
              }
              else if ((state->decoder).read_text_chunks != 0) {
                uVar10 = readChunk_zTXt(info_01,(LodePNGDecompressSettings *)state,data,uVar22);
                goto LAB_0011c1de;
              }
            }
            else {
              uVar10 = readChunk_tRNS(info,data,uVar22);
LAB_0011c0f1:
              state->error = uVar10;
joined_r0x0011c1e6:
              if (uVar10 != 0) goto LAB_0011c40f;
            }
LAB_0011c106:
            bVar7 = true;
            bVar27 = false;
LAB_0011c109:
            if (((state->decoder).ignore_crc == 0) &&
               (uVar10 = lodepng_chunk_check_crc(puVar17), uVar10 != 0)) {
              uVar10 = 0x39;
              goto LAB_0011c404;
            }
            if (bVar7) goto LAB_0011c370;
            goto LAB_0011bfa4;
          }
LAB_0011c40f:
          if ((info->colortype == LCT_PALETTE) && ((state->info_png).color.palette == (uchar *)0x0))
          {
            state->error = 0x6a;
          }
          else if (bVar27) {
            uVar10 = (state->info_png).interlace_method;
            uVar13 = lodepng_get_bpp(info);
            uVar14 = *w;
            uVar22 = (ulong)uVar13;
            if (uVar10 == 0) {
              sVar20 = (uVar22 * (uVar14 >> 3) + (ulong)((uVar14 & 7) * uVar13 + 7 >> 3) + 1) *
                       (ulong)*h;
            }
            else {
              uVar12 = *h;
              lVar23 = (uVar14 + 7 >> 6) * uVar22 + (ulong)((uVar14 + 7 >> 3 & 7) * uVar13 + 7 >> 3)
                       + 1;
              uVar10 = uVar14 + 3;
              if (4 < uVar14) {
                lVar23 = lVar23 + (ulong)((uVar10 >> 3 & 7) * uVar13 + 7 >> 3) +
                                  (uVar10 >> 6) * uVar22 + 1;
              }
              lVar23 = (ulong)(uVar12 + 3 >> 3) *
                       ((uVar10 >> 5) * uVar22 + (ulong)((uVar10 >> 2 & 7) * uVar13 + 7 >> 3) + 1) +
                       lVar23 * (ulong)(uVar12 + 7 >> 3);
              uVar10 = uVar14 + 1;
              if (2 < uVar14) {
                lVar23 = lVar23 + (ulong)(uVar12 + 3 >> 2) *
                                  ((ulong)((uVar10 >> 2 & 7) * uVar13 + 7 >> 3) +
                                   (uVar10 >> 5) * uVar22 + 1);
              }
              lVar23 = (ulong)(uVar12 + 1 >> 2) *
                       ((uVar10 >> 4) * uVar22 + (ulong)((uVar10 >> 1 & 7) * uVar13 + 7 >> 3) + 1) +
                       lVar23;
              if (1 < uVar14) {
                lVar23 = lVar23 + (ulong)(uVar12 + 1 >> 1) *
                                  ((ulong)((uVar14 >> 1 & 7) * uVar13 + 7 >> 3) +
                                   (uVar14 >> 4) * uVar22 + 1);
              }
              sVar20 = ((uVar14 >> 3) * uVar22 + (ulong)((uVar14 & 7) * uVar13 + 7 >> 3) + 1) *
                       (ulong)(uVar12 >> 1) + lVar23;
            }
            uVar14 = zlib_decompress(&scanlines,&scanlines_size,sVar20,puVar16,local_2b0,
                                     (LodePNGDecompressSettings *)state);
            bVar27 = scanlines_size != sVar20;
            uVar10 = 0x5b;
            if (!bVar27) {
              uVar10 = uVar14;
            }
            if (uVar14 != 0) {
              uVar10 = uVar14;
            }
            state->error = uVar10;
            free(puVar16);
            if (uVar14 != 0 || bVar27) goto LAB_0011ca3f;
            uVar10 = *w;
            uVar14 = *h;
            sVar20 = lodepng_get_raw_size(uVar10,uVar14,info);
            puVar17 = (uchar *)malloc(sVar20);
            puVar16 = scanlines;
            *local_260 = puVar17;
            if (puVar17 == (uchar *)0x0) {
              uVar13 = 0x53;
              goto LAB_0011ca37;
            }
            for (sVar18 = 0; sVar20 != sVar18; sVar18 = sVar18 + 1) {
              puVar17[sVar18] = '\0';
            }
            uVar12 = lodepng_get_bpp(info);
            if (uVar12 == 0) {
              uVar13 = 0x1f;
            }
            else if ((state->info_png).interlace_method == 0) {
              if (uVar12 < 8) {
                uVar11 = uVar12 * uVar10;
                uVar26 = uVar11 + 7 & 0xfffffff8;
                if (uVar11 != uVar26) {
                  uVar13 = unfilter(puVar16,puVar16,uVar10,uVar14,uVar12);
                  if (uVar13 == 0) {
                    removePaddingBits(puVar17,puVar16,(ulong)uVar11,(ulong)uVar26,uVar14);
                    goto LAB_0011ca35;
                  }
                  goto LAB_0011ca37;
                }
              }
              uVar13 = unfilter(puVar17,puVar16,uVar10,uVar14,uVar12);
              if (uVar13 == 0) goto LAB_0011ca35;
            }
            else {
              Adam7_getpassvalues(passw,passh,filter_passstart,padded_passstart,local_178,uVar10,
                                  uVar14,uVar12);
              for (lVar23 = 0; lVar23 != 0x1c; lVar23 = lVar23 + 4) {
                lVar3 = *(long *)((long)padded_passstart + lVar23 * 2);
                uVar11 = *(uint *)((long)passw + lVar23);
                uVar26 = *(uint *)((long)passh + lVar23);
                uVar13 = unfilter(puVar16 + lVar3,
                                  puVar16 + *(long *)((long)filter_passstart + lVar23 * 2),uVar11,
                                  uVar26,uVar12);
                if (uVar13 != 0) goto LAB_0011ca37;
                if (uVar12 < 8) {
                  uVar11 = uVar11 * uVar12;
                  removePaddingBits(puVar16 + *(long *)((long)local_178 + lVar23 * 2),
                                    puVar16 + lVar3,(ulong)uVar11,(ulong)(uVar11 + 7 & 0xfffffff8),
                                    uVar26);
                }
              }
              Adam7_getpassvalues(passw_1,passh_1,filter_passstart_1,padded_passstart_1,passstart,
                                  uVar10,uVar14,uVar12);
              if (uVar12 < 8) {
                for (lVar23 = 0; lVar23 != 7; lVar23 = lVar23 + 1) {
                  uVar14 = passw_1[lVar23];
                  uVar13 = passh_1[lVar23];
                  for (uVar22 = 0; uVar22 != uVar13; uVar22 = uVar22 + 1) {
                    for (uVar25 = 0; uVar25 != uVar14; uVar25 = uVar25 + 1) {
                      uVar21 = (ulong)(((int)uVar22 * uVar14 + (int)uVar25) * uVar12) +
                               passstart[lVar23] * 8;
                      local_240 = (ADAM7_DX[lVar23] * uVar25 + (ulong)ADAM7_IX[lVar23]) *
                                  (ulong)uVar12 +
                                  (ADAM7_DY[lVar23] * uVar22 + (ulong)ADAM7_IY[lVar23]) *
                                  (ulong)(uVar10 * uVar12);
                      uVar24 = (ulong)uVar12;
                      while (iVar15 = (int)uVar24, uVar24 = (ulong)(iVar15 - 1), iVar15 != 0) {
                        uVar19 = uVar21 >> 3;
                        bVar6 = (byte)uVar21;
                        uVar21 = uVar21 + 1;
                        setBitOfReversedStream
                                  (&local_240,puVar17,(puVar16[uVar19] >> (~bVar6 & 7) & 1) != 0);
                      }
                    }
                  }
                }
              }
              else {
                uVar22 = (ulong)(uVar12 >> 3);
                for (lVar23 = 0; lVar23 != 7; lVar23 = lVar23 + 1) {
                  uVar14 = passh_1[lVar23];
                  for (uVar25 = 0; uVar25 != uVar14; uVar25 = uVar25 + 1) {
                    uVar13 = passw_1[lVar23];
                    uVar12 = uVar13 * (int)uVar25;
                    for (uVar21 = 0; uVar21 != uVar13; uVar21 = uVar21 + 1) {
                      uVar11 = ADAM7_IY[lVar23];
                      uVar26 = ADAM7_IX[lVar23];
                      uVar1 = ADAM7_DX[lVar23];
                      uVar2 = ADAM7_DY[lVar23];
                      sVar20 = passstart[lVar23];
                      for (uVar24 = 0; uVar22 != uVar24; uVar24 = uVar24 + 1) {
                        puVar17[uVar24 + ((uVar2 * uVar25 + (ulong)uVar11) * (ulong)uVar10 +
                                         uVar1 * uVar21 + (ulong)uVar26) * uVar22] =
                             puVar16[uVar24 + uVar12 * uVar22 + sVar20];
                      }
                      uVar12 = uVar12 + 1;
                    }
                  }
                }
              }
LAB_0011ca35:
              uVar13 = 0;
            }
LAB_0011ca37:
            state->error = uVar13;
LAB_0011ca3f:
            free(scanlines);
            if (state->error != 0) {
              return state->error;
            }
            if ((state->decoder).color_convert == 0) {
              uVar10 = lodepng_color_mode_copy(info_00,info);
              state->error = uVar10;
              return uVar10;
            }
            iVar15 = lodepng_color_mode_equal(info_00,info);
            ppuVar8 = local_260;
            if (iVar15 != 0) {
              return 0;
            }
            puVar16 = *local_260;
            if (((info_00->colortype | LCT_GREY_ALPHA) != LCT_RGBA) &&
               ((state->info_raw).bitdepth != 8)) {
              return 0x38;
            }
            uVar10 = *w;
            uVar14 = *h;
            sVar20 = lodepng_get_raw_size(uVar10,uVar14,info_00);
            puVar17 = (uchar *)malloc(sVar20);
            *ppuVar8 = puVar17;
            if (puVar17 == (uchar *)0x0) {
              uVar10 = 0x53;
            }
            else {
              uVar10 = lodepng_convert(puVar17,puVar16,info_00,info,uVar10,uVar14);
            }
            state->error = uVar10;
            free(puVar16);
            return state->error;
          }
          free(puVar16);
          goto LAB_0011ca3f;
        }
        uVar10 = 0x53;
      }
    }
    state->error = uVar10;
  }
  return uVar10;
LAB_0011c370:
  puVar17 = lodepng_chunk_next_const(puVar17,in + insize);
  goto LAB_0011bf81;
}

Assistant:

unsigned lodepng_decode(unsigned char** out, unsigned* w, unsigned* h,
                        LodePNGState* state,
                        const unsigned char* in, size_t insize) {
  *out = 0;
  decodeGeneric(out, w, h, state, in, insize);
  if(state->error) return state->error;
  if(!state->decoder.color_convert || lodepng_color_mode_equal(&state->info_raw, &state->info_png.color)) {
    /*same color type, no copying or converting of data needed*/
    /*store the info_png color settings on the info_raw so that the info_raw still reflects what colortype
    the raw image has to the end user*/
    if(!state->decoder.color_convert) {
      state->error = lodepng_color_mode_copy(&state->info_raw, &state->info_png.color);
      if(state->error) return state->error;
    }
  } else { /*color conversion needed*/
    unsigned char* data = *out;
    size_t outsize;

    /*TODO: check if this works according to the statement in the documentation: "The converter can convert
    from grayscale input color type, to 8-bit grayscale or grayscale with alpha"*/
    if(!(state->info_raw.colortype == LCT_RGB || state->info_raw.colortype == LCT_RGBA)
       && !(state->info_raw.bitdepth == 8)) {
      return 56; /*unsupported color mode conversion*/
    }

    outsize = lodepng_get_raw_size(*w, *h, &state->info_raw);
    *out = (unsigned char*)lodepng_malloc(outsize);
    if(!(*out)) {
      state->error = 83; /*alloc fail*/
    }
    else state->error = lodepng_convert(*out, data, &state->info_raw,
                                        &state->info_png.color, *w, *h);
    lodepng_free(data);
  }
  return state->error;
}